

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

VP8StatusCode IDecode(WebPIDecoder *idec)

{
  VP8Io *pVVar1;
  size_t *psVar2;
  VP8BitReader *token_br;
  VP8BitReader *pVVar3;
  uint8_t **ppuVar4;
  VP8MB VVar5;
  VP8MB VVar6;
  WebPDecBuffer *pWVar7;
  void *pvVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  VP8StatusCode VVar16;
  int iVar17;
  VP8LDecoder *pVVar18;
  size_t sVar19;
  VP8Decoder *pVVar20;
  uint8_t *puVar21;
  WebPWorkerInterface *pWVar22;
  uint uVar23;
  DecState DVar24;
  VP8Decoder *dec;
  VP8StatusCode VVar25;
  size_t sVar26;
  uint3 *data;
  ulong uVar27;
  int height;
  int width;
  VP8StatusCode local_9c;
  int local_7c;
  WebPHeaderStructure local_78;
  
  if (idec->state == STATE_WEBP_HEADER) {
    local_78.data_size = (idec->mem).start;
    local_78.data = (idec->mem).buf + local_78.data_size;
    local_78.data_size = (idec->mem).end - local_78.data_size;
    local_78.have_all_data = 0;
    VVar16 = WebPParseHeaders(&local_78);
    if (VVar16 == VP8_STATUS_OK) {
      idec->chunk_size =
           CONCAT44(local_78.compressed_size._4_4_,(undefined4)local_78.compressed_size);
      idec->is_lossless = local_78.is_lossless;
      if (local_78.is_lossless == 0) {
        pVVar20 = VP8New();
        if (pVVar20 == (VP8Decoder *)0x0) goto LAB_0010a2d5;
        pVVar20->incremental = 1;
        idec->dec = pVVar20;
        pVVar20->alpha_data =
             (uint8_t *)CONCAT44(local_78.alpha_data._4_4_,local_78.alpha_data._0_4_);
        pVVar20->alpha_data_size =
             CONCAT44(local_78.alpha_data_size._4_4_,(undefined4)local_78.alpha_data_size);
        sVar26 = (idec->mem).end;
        sVar19 = (idec->mem).start + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state = STATE_VP8_HEADER;
        (idec->mem).start = sVar19;
        (idec->io).data = (idec->mem).buf + sVar19;
        (idec->io).data_size = sVar26 - sVar19;
      }
      else {
        pVVar18 = VP8LNew();
        if (pVVar18 == (VP8LDecoder *)0x0) {
LAB_0010a2d5:
          VVar25 = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_0010a2db;
        }
        idec->dec = pVVar18;
        sVar26 = (idec->mem).end;
        sVar19 = (idec->mem).start + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state = STATE_VP8L_HEADER;
        (idec->mem).start = sVar19;
        (idec->io).data = (idec->mem).buf + sVar19;
        (idec->io).data_size = sVar26 - sVar19;
      }
      VVar25 = VP8_STATUS_OK;
    }
    else {
      VVar25 = VP8_STATUS_SUSPENDED;
      if (VVar16 != VP8_STATUS_NOT_ENOUGH_DATA) {
        if (idec->state == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
        }
        idec->state = STATE_ERROR;
        VVar25 = VVar16;
      }
    }
  }
  else {
    VVar25 = VP8_STATUS_SUSPENDED;
    if (idec->dec == (void *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
LAB_0010a2db:
  if (idec->state == STATE_VP8_HEADER) {
    sVar26 = (idec->mem).start;
    uVar27 = (idec->mem).end - sVar26;
    VVar25 = VP8_STATUS_SUSPENDED;
    if (9 < uVar27) {
      data = (uint3 *)((idec->mem).buf + sVar26);
      iVar15 = VP8GetInfo((uint8_t *)data,uVar27,idec->chunk_size,(int *)&local_78,&local_7c);
      if (iVar15 == 0) {
        VVar25 = VP8_STATUS_BITSTREAM_ERROR;
        DVar24 = STATE_ERROR;
        if (idec->state == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
        }
      }
      else {
        (idec->mem).part0_size = (ulong)((*data >> 5) + 10);
        (idec->io).data = (uint8_t *)data;
        (idec->io).data_size = uVar27;
        VVar25 = VP8_STATUS_OK;
        DVar24 = STATE_VP8_PARTS0;
      }
      idec->state = DVar24;
    }
  }
  if ((idec->state != STATE_VP8_PARTS0) ||
     (VVar25 = VP8_STATUS_SUSPENDED, (idec->mem).end - (idec->mem).start < (idec->mem).part0_size))
  goto LAB_0010a4ff;
  pWVar7 = (idec->params).output;
  pVVar20 = (VP8Decoder *)idec->dec;
  pVVar1 = &idec->io;
  iVar15 = VP8GetHeaders(pVVar20,pVVar1);
  if (iVar15 == 0) {
    VVar16 = pVVar20->status;
    if ((VVar16 & ~VP8_STATUS_INVALID_PARAM) == VP8_STATUS_SUSPENDED) goto LAB_0010a4ff;
  }
  else {
    VVar16 = WebPAllocateDecBuffer((idec->io).width,(idec->io).height,(idec->params).options,pWVar7)
    ;
    pVVar20->status = VVar16;
    if (VVar16 == VP8_STATUS_OK) {
      bVar14 = false;
      iVar15 = VP8GetThreadMethod((idec->params).options,(WebPHeaderStructure *)0x0,(idec->io).width
                                  ,(idec->io).height);
      pVVar20->mt_method = iVar15;
      VP8InitDithering((idec->params).options,pVVar20);
      pvVar8 = idec->dec;
      sVar26 = *(long *)((long)pvVar8 + 0x28) - *(long *)((long)pvVar8 + 0x20);
      if (sVar26 == 0) {
        VVar16 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        if ((idec->mem).mode == MEM_MODE_APPEND) {
          puVar21 = (uint8_t *)WebPSafeMalloc(1,sVar26);
          if (puVar21 == (uint8_t *)0x0) {
            VVar16 = VP8_STATUS_OUT_OF_MEMORY;
            bVar14 = false;
            goto LAB_0010a4c3;
          }
          memcpy(puVar21,*(void **)((long)pvVar8 + 0x20),sVar26);
          (idec->mem).part0_buf = puVar21;
          VP8BitReaderSetBuffer((VP8BitReader *)((long)pvVar8 + 0x10),puVar21,sVar26);
        }
        psVar2 = &(idec->mem).start;
        *psVar2 = *psVar2 + sVar26;
        VVar16 = VP8_STATUS_OK;
        bVar14 = true;
      }
LAB_0010a4c3:
      pVVar20->status = VVar16;
      if (bVar14) {
        VVar16 = VP8EnterCritical(pVVar20,pVVar1);
        if (VVar16 == VP8_STATUS_OK) {
          idec->state = STATE_VP8_DATA;
          iVar15 = VP8InitFrame(pVVar20,pVVar1);
          VVar25 = VP8_STATUS_OK;
          if (iVar15 != 0) goto LAB_0010a4ff;
        }
        VVar16 = pVVar20->status;
      }
    }
  }
  if (idec->state == STATE_VP8_DATA) {
    VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
  }
  idec->state = STATE_ERROR;
  VVar25 = VVar16;
LAB_0010a4ff:
  if (idec->state == STATE_VP8_DATA) {
    pVVar20 = (VP8Decoder *)idec->dec;
    if (pVVar20 != (VP8Decoder *)0x0) {
      pVVar1 = &idec->io;
      dec = pVVar20;
      if (pVVar20->ready == 0) {
LAB_0010a762:
        VP8ExitCritical(dec,pVVar1);
LAB_0010a76a:
        idec->state = STATE_ERROR;
        VVar25 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        iVar15 = pVVar20->mb_y;
        if (iVar15 < pVVar20->mb_h) {
          do {
            if (idec->last_mb_y != iVar15) {
              iVar15 = VP8ParseIntraModeRow(&pVVar20->br,pVVar20);
              if (iVar15 == 0) {
                if (idec->state != STATE_VP8_DATA) goto LAB_0010a76a;
                dec = (VP8Decoder *)idec->dec;
                goto LAB_0010a762;
              }
              idec->last_mb_y = pVVar20->mb_y;
            }
            iVar15 = pVVar20->mb_x;
            while (iVar15 < pVVar20->mb_w) {
              uVar23 = pVVar20->num_parts_minus_one & pVVar20->mb_y;
              token_br = pVVar20->parts + uVar23;
              VVar5 = pVVar20->mb_info[-1];
              VVar6 = pVVar20->mb_info[iVar15];
              pVVar3 = pVVar20->parts + uVar23;
              uVar9 = pVVar3->range;
              uVar10 = pVVar3->bits;
              ppuVar4 = &pVVar20->parts[uVar23].buf;
              puVar21 = *ppuVar4;
              puVar11 = ppuVar4[1];
              ppuVar4 = &pVVar20->parts[uVar23].buf_max;
              puVar12 = *ppuVar4;
              uVar13 = ppuVar4[1];
              local_78.alpha_data._4_4_ = SUB84(puVar12,0);
              local_78.alpha_data_size._0_4_ = (undefined4)((ulong)puVar12 >> 0x20);
              local_78.alpha_data_size._4_4_ = (undefined4)uVar13;
              local_78.compressed_size._0_4_ = (undefined4)((ulong)uVar13 >> 0x20);
              local_78._20_4_ = SUB84(puVar21,0);
              local_78.offset._0_4_ = (undefined4)((ulong)puVar21 >> 0x20);
              local_78.offset._4_4_ = SUB84(puVar11,0);
              local_78.alpha_data._0_4_ = (undefined4)((ulong)puVar11 >> 0x20);
              local_78.data._4_4_ = (undefined4)pVVar3->value;
              local_78.data_size._0_4_ = (undefined4)(pVVar3->value >> 0x20);
              local_78.data_size._4_4_ = uVar9;
              local_78.have_all_data = uVar10;
              iVar15 = VP8DecodeMB(pVVar20,token_br);
              if (iVar15 == 0) {
                if ((pVVar20->num_parts_minus_one == 0) &&
                   (0x1000 < (idec->mem).end - (idec->mem).start)) {
LAB_0010a6cd:
                  if (idec->state == STATE_VP8_DATA) {
                    VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
                  }
                  idec->state = STATE_ERROR;
                  local_9c = VP8_STATUS_BITSTREAM_ERROR;
                }
                else {
                  if (0 < pVVar20->mt_method) {
                    pWVar22 = WebPGetWorkerInterface();
                    iVar17 = (*pWVar22->Sync)(&pVVar20->worker);
                    if (iVar17 == 0) goto LAB_0010a6cd;
                  }
                  pVVar20->mb_info[-1] = VVar5;
                  pVVar20->mb_info[pVVar20->mb_x] = VVar6;
                  token_br->buf_max =
                       (uint8_t *)
                       CONCAT44((undefined4)local_78.alpha_data_size,local_78.alpha_data._4_4_);
                  *(ulong *)&token_br->eof =
                       CONCAT44((undefined4)local_78.compressed_size,local_78.alpha_data_size._4_4_)
                  ;
                  token_br->buf = (uint8_t *)CONCAT44((undefined4)local_78.offset,local_78._20_4_);
                  token_br->buf_end =
                       (uint8_t *)CONCAT44(local_78.alpha_data._0_4_,local_78.offset._4_4_);
                  token_br->value = CONCAT44((undefined4)local_78.data_size,local_78.data._4_4_);
                  token_br->range = local_78.data_size._4_4_;
                  token_br->bits = local_78.have_all_data;
                  local_9c = VP8_STATUS_SUSPENDED;
                }
              }
              else if (pVVar20->num_parts_minus_one == 0) {
                (idec->mem).start = (long)token_br->buf - (long)(idec->mem).buf;
              }
              VVar25 = local_9c;
              if (iVar15 == 0) goto LAB_0010a7c3;
              iVar15 = pVVar20->mb_x + 1;
              pVVar20->mb_x = iVar15;
            }
            VP8InitScanline(pVVar20);
            iVar15 = VP8ProcessRow(pVVar20,pVVar1);
            if (iVar15 == 0) {
              if (idec->state == STATE_VP8_DATA) {
                VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
              }
              goto LAB_0010a7b6;
            }
            iVar15 = pVVar20->mb_y + 1;
            pVVar20->mb_y = iVar15;
            if (pVVar20->mb_h <= iVar15) break;
          } while( true );
        }
        iVar15 = VP8ExitCritical(pVVar20,pVVar1);
        if (iVar15 == 0) {
LAB_0010a7b6:
          idec->state = STATE_ERROR;
          VVar25 = VP8_STATUS_USER_ABORT;
        }
        else {
          pVVar20->ready = 0;
          VVar25 = FinishDecoding(idec);
        }
      }
    }
LAB_0010a7c3:
    if (pVVar20 == (VP8Decoder *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
  if (idec->state == STATE_VP8L_HEADER) {
    uVar27 = (idec->mem).end - (idec->mem).start;
    pVVar18 = (VP8LDecoder *)idec->dec;
    if (uVar27 < idec->chunk_size >> 3) {
      pVVar18->status = VP8_STATUS_SUSPENDED;
      VVar25 = VP8_STATUS_SUSPENDED;
    }
    else {
      pVVar1 = &idec->io;
      pWVar7 = (idec->params).output;
      iVar15 = VP8LDecodeHeader(pVVar18,pVVar1);
      if (iVar15 == 0) {
        if ((pVVar18->status == VP8_STATUS_BITSTREAM_ERROR) && (uVar27 < idec->chunk_size)) {
          pVVar18->status = VP8_STATUS_SUSPENDED;
        }
        VVar16 = pVVar18->status;
        VVar25 = VP8_STATUS_SUSPENDED;
        if ((VVar16 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) {
          if (idec->state == STATE_VP8_DATA) {
            VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
          }
          idec->state = STATE_ERROR;
          VVar25 = VVar16;
        }
      }
      else {
        VVar25 = WebPAllocateDecBuffer
                           ((idec->io).width,(idec->io).height,(idec->params).options,pWVar7);
        pVVar18->status = VVar25;
        if (VVar25 == VP8_STATUS_OK) {
          idec->state = STATE_VP8L_DATA;
          VVar25 = VP8_STATUS_OK;
        }
        else {
          if (idec->state == STATE_VP8_DATA) {
            VP8ExitCritical((VP8Decoder *)idec->dec,pVVar1);
          }
          idec->state = STATE_ERROR;
        }
      }
    }
  }
  if (idec->state == STATE_VP8L_DATA) {
    pVVar18 = (VP8LDecoder *)idec->dec;
    pVVar18->incremental = (uint)((idec->mem).end - (idec->mem).start < idec->chunk_size);
    iVar15 = VP8LDecodeImage(pVVar18);
    VVar16 = pVVar18->status;
    if (iVar15 == 0) {
      VVar25 = VP8_STATUS_SUSPENDED;
      if ((VVar16 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) {
        if (idec->state == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec,&idec->io);
        }
        idec->state = STATE_ERROR;
        VVar25 = VVar16;
      }
    }
    else {
      VVar25 = VP8_STATUS_SUSPENDED;
      if (VVar16 != VP8_STATUS_SUSPENDED) {
        VVar25 = FinishDecoding(idec);
      }
    }
  }
  return VVar25;
}

Assistant:

static VP8StatusCode IDecode(WebPIDecoder* idec) {
  VP8StatusCode status = VP8_STATUS_SUSPENDED;

  if (idec->state == STATE_WEBP_HEADER) {
    status = DecodeWebPHeaders(idec);
  } else {
    if (idec->dec == NULL) {
      return VP8_STATUS_SUSPENDED;    // can't continue if we have no decoder.
    }
  }
  if (idec->state == STATE_VP8_HEADER) {
    status = DecodeVP8FrameHeader(idec);
  }
  if (idec->state == STATE_VP8_PARTS0) {
    status = DecodePartition0(idec);
  }
  if (idec->state == STATE_VP8_DATA) {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec;
    if (dec == NULL) {
      return VP8_STATUS_SUSPENDED;  // can't continue if we have no decoder.
    }
    status = DecodeRemaining(idec);
  }
  if (idec->state == STATE_VP8L_HEADER) {
    status = DecodeVP8LHeader(idec);
  }
  if (idec->state == STATE_VP8L_DATA) {
    status = DecodeVP8LData(idec);
  }
  return status;
}